

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O2

void __thiscall QAbstractItemView::keyboardSearch(QAbstractItemView *this,QString *search)

{
  QPersistentModelIndex *this_00;
  long lVar1;
  long *plVar2;
  char cVar3;
  compare_eq_result_container<QList<QModelIndex>,_QModelIndex> cVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  QModelIndex *pQVar8;
  ulong uVar9;
  undefined1 *puVar10;
  long in_FS_OFFSET;
  bool bVar11;
  uint local_158;
  uint local_154;
  QAbstractItemModel *local_148;
  quintptr local_130;
  QArrayDataPointer<QModelIndex> local_110;
  QArrayDataPointer<QModelIndex> local_f8;
  QModelIndex local_d8;
  QArrayDataPointer<QModelIndex> local_b8;
  QModelIndex local_98;
  QModelIndex local_78;
  undefined1 *local_58;
  undefined1 *puStack_50;
  totally_ordered_wrapper<const_QAbstractItemModel_*> tStack_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)(this + 8);
  plVar2 = *(long **)(lVar1 + 0x2f8);
  this_00 = (QPersistentModelIndex *)(lVar1 + 0x3b8);
  QPersistentModelIndex::operator_cast_to_QModelIndex((QModelIndex *)&local_58,this_00);
  iVar5 = (**(code **)(*plVar2 + 0x78))(plVar2,(QModelIndex *)&local_58);
  if (iVar5 == 0) goto LAB_004e78c0;
  plVar2 = *(long **)(lVar1 + 0x2f8);
  QPersistentModelIndex::operator_cast_to_QModelIndex(&local_78,this_00);
  iVar5 = (**(code **)(*plVar2 + 0x80))(plVar2,&local_78);
  if (iVar5 == 0) goto LAB_004e78c0;
  puVar10 = &DAT_aaaaaaaaaaaaaaaa;
  local_78.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
  local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_78.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
  currentIndex((QModelIndex *)&local_58,this);
  if ((((int)local_58 < 0) || ((long)local_58 < 0)) || (tStack_48.ptr == (QAbstractItemModel *)0x0))
  {
    plVar2 = *(long **)(lVar1 + 0x2f8);
    QPersistentModelIndex::operator_cast_to_QModelIndex(&local_98,this_00);
    (**(code **)(*plVar2 + 0x60))(&local_78,plVar2,0,0,&local_98);
  }
  else {
    currentIndex(&local_78,this);
  }
  cVar3 = QElapsedTimer::isValid();
  if (cVar3 == '\0') {
    QElapsedTimer::start();
  }
  else {
    puVar10 = (undefined1 *)QElapsedTimer::restart();
  }
  if ((cVar3 == '\x01' && (search->d).size != 0) &&
     (iVar5 = QApplication::keyboardInputInterval(), (long)puVar10 <= (long)iVar5)) {
    QString::append((QString *)(lVar1 + 0x3f0));
    bVar11 = false;
  }
  else {
    QString::operator=((QString *)(lVar1 + 0x3f0),(QString *)search);
    currentIndex((QModelIndex *)&local_58,this);
    bVar11 = false;
    if ((-1 < (int)local_58) && (-1 < (long)local_58)) {
      bVar11 = tStack_48.ptr != (QAbstractItemModel *)0x0;
    }
  }
  if (*(ulong *)(lVar1 + 0x400) < 2) {
    if (bVar11) goto LAB_004e7520;
  }
  else {
    iVar5 = QString::count((QChar)(char16_t)(QString *)(lVar1 + 0x3f0),
                           (uint)*(ushort *)
                                  (*(long *)(lVar1 + 0x3f8) + -2 + *(ulong *)(lVar1 + 0x400) * 2));
    if ((long)iVar5 == *(long *)(lVar1 + 0x400) || bVar11) {
LAB_004e7520:
      tStack_48.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
      local_58 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
      QModelIndex::parent((QModelIndex *)&local_58,&local_78);
      iVar5 = local_78.r;
      iVar6 = (**(code **)(**(long **)(lVar1 + 0x2f8) + 0x78))
                        (*(long **)(lVar1 + 0x2f8),(QModelIndex *)&local_58);
      iVar7 = 0;
      if (iVar5 < iVar6 + -1) {
        iVar7 = local_78.r + 1;
      }
      (**(code **)(**(long **)(lVar1 + 0x2f8) + 0x60))
                (&local_98,*(long **)(lVar1 + 0x2f8),iVar7,local_78.c,(QModelIndex *)&local_58);
      local_78.m.ptr = local_98.m.ptr;
      local_78.r = local_98.r;
      local_78.c = local_98.c;
      local_78.i = local_98.i;
    }
  }
  local_98.m.ptr = local_78.m.ptr;
  local_98.r = local_78.r;
  local_98.c = local_78.c;
  local_98.i = local_78.i;
  local_b8.size = 0;
  local_d8.r = -1;
  local_d8.c = -1;
  local_b8.d = (Data *)0x0;
  local_b8.ptr = (QModelIndex *)0x0;
  local_d8.i = 0;
  local_d8.m.ptr = (QAbstractItemModel *)0x0;
  local_f8.d = (Data *)0x0;
  local_f8.ptr = (QModelIndex *)0x0;
  local_f8.size = 0;
  local_130 = 0;
  local_148 = (QAbstractItemModel *)0x0;
  local_158 = 0xffffffff;
  local_154 = local_158;
  while( true ) {
    plVar2 = *(long **)(lVar1 + 0x2f8);
    ::QVariant::QVariant((QVariant *)&local_58,(QString *)(lVar1 + 0x3f0));
    (**(code **)(*plVar2 + 0x150))(&local_110,plVar2,&local_98,0,(QModelIndex *)&local_58,1,0x22);
    QArrayDataPointer<QModelIndex>::operator=(&local_b8,&local_110);
    QArrayDataPointer<QModelIndex>::~QArrayDataPointer(&local_110);
    ::QVariant::~QVariant((QVariant *)&local_58);
    cVar4 = QList<QModelIndex>::operator==
                      ((QList<QModelIndex> *)&local_b8,(QList<QModelIndex> *)&local_f8);
    if (cVar4) break;
    local_58 = (undefined1 *)0xffffffffffffffff;
    puStack_50 = (undefined1 *)0x0;
    tStack_48.ptr = (QAbstractItemModel *)0x0;
    pQVar8 = (QModelIndex *)&local_58;
    if (local_b8.size != 0) {
      pQVar8 = local_b8.ptr;
    }
    local_d8.m.ptr = (pQVar8->m).ptr;
    local_d8.r = pQVar8->r;
    local_d8.c = pQVar8->c;
    local_d8.i = pQVar8->i;
    QArrayDataPointer<QModelIndex>::operator=(&local_f8,&local_b8);
    if (((-1 < local_d8.r) && (-1 < (long)local_d8._0_8_)) &&
       (local_d8.m.ptr != (QAbstractItemModel *)0x0)) {
      uVar9 = (**(code **)(**(long **)(lVar1 + 0x2f8) + 0x138))(*(long **)(lVar1 + 0x2f8),&local_d8)
      ;
      if ((uVar9 & 0x20) != 0) {
        setCurrentIndex(this,&local_d8);
        break;
      }
      iVar5 = local_d8.r + 1;
      plVar2 = *(long **)(lVar1 + 0x2f8);
      QModelIndex::parent((QModelIndex *)&local_58,&local_d8);
      iVar7 = (**(code **)(*plVar2 + 0x78))(plVar2,(QModelIndex *)&local_58);
      if (iVar7 <= iVar5) {
        iVar5 = 0;
      }
      QModelIndex::sibling((QModelIndex *)&local_58,&local_d8,iVar5,local_d8.c);
      local_98.m.ptr = tStack_48.ptr;
      local_98._0_8_ = local_58;
      local_98.i = (quintptr)puStack_50;
      if ((int)(local_154 | local_158) < 0 || local_148 == (QAbstractItemModel *)0x0) {
        local_158 = local_d8.c;
        local_130 = local_d8.i;
        local_148 = local_d8.m.ptr;
        local_154 = local_d8.r;
      }
      else if ((((local_154 == local_d8.r) && (local_158 == local_d8.c)) &&
               (local_130 == local_d8.i)) && (local_148 == local_d8.m.ptr)) break;
    }
    bVar11 = ::operator!=(&local_98,&local_78);
    if (((!bVar11) || (local_d8.r < 0)) ||
       (((long)local_d8._0_8_ < 0 || (local_d8.m.ptr == (QAbstractItemModel *)0x0)))) break;
  }
  QArrayDataPointer<QModelIndex>::~QArrayDataPointer(&local_f8);
  QArrayDataPointer<QModelIndex>::~QArrayDataPointer(&local_b8);
LAB_004e78c0:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QAbstractItemView::keyboardSearch(const QString &search)
{
    Q_D(QAbstractItemView);
    if (!d->model->rowCount(d->root) || !d->model->columnCount(d->root))
        return;

    QModelIndex start = currentIndex().isValid() ? currentIndex()
                        : d->model->index(0, 0, d->root);
    bool skipRow = false;
    bool keyboardTimeWasValid = d->keyboardInputTime.isValid();
    qint64 keyboardInputTimeElapsed;
    if (keyboardTimeWasValid)
        keyboardInputTimeElapsed = d->keyboardInputTime.restart();
    else
        d->keyboardInputTime.start();
    if (search.isEmpty() || !keyboardTimeWasValid
        || keyboardInputTimeElapsed > QApplication::keyboardInputInterval()) {
        d->keyboardInput = search;
        skipRow = currentIndex().isValid(); //if it is not valid we should really start at QModelIndex(0,0)
    } else {
        d->keyboardInput += search;
    }

    // special case for searches with same key like 'aaaaa'
    bool sameKey = false;
    if (d->keyboardInput.size() > 1) {
        int c = d->keyboardInput.count(d->keyboardInput.at(d->keyboardInput.size() - 1));
        sameKey = (c == d->keyboardInput.size());
        if (sameKey)
            skipRow = true;
    }

    // skip if we are searching for the same key or a new search started
    if (skipRow) {
        QModelIndex parent = start.parent();
        int newRow = (start.row() < d->model->rowCount(parent) - 1) ? start.row() + 1 : 0;
        start = d->model->index(newRow, start.column(), parent);
    }

    // search from start with wraparound
    QModelIndex current = start;
    QModelIndexList match;
    QModelIndex firstMatch;
    QModelIndex startMatch;
    QModelIndexList previous;
    do {
        match = d->model->match(current, Qt::DisplayRole, d->keyboardInput);
        if (match == previous)
            break;
        firstMatch = match.value(0);
        previous = match;
        if (firstMatch.isValid()) {
            if (d->isIndexEnabled(firstMatch)) {
                setCurrentIndex(firstMatch);
                break;
            }
            int row = firstMatch.row() + 1;
            if (row >= d->model->rowCount(firstMatch.parent()))
                row = 0;
            current = firstMatch.sibling(row, firstMatch.column());

            //avoid infinite loop if all the matching items are disabled.
            if (!startMatch.isValid())
                startMatch = firstMatch;
            else if (startMatch == firstMatch)
                break;
        }
    } while (current != start && firstMatch.isValid());
}